

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O3

Vec_Str_t * Lms_GiaAreas(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  size_t __size;
  int iVar3;
  Vec_Str_t *pVVar4;
  char *pcVar5;
  int iVar6;
  ulong uVar7;
  char cVar8;
  long lVar9;
  Vec_Int_t *pVVar10;
  
  pVVar10 = p->vCos;
  iVar3 = pVVar10->nSize;
  pVVar4 = (Vec_Str_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar6 = iVar3;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar6;
  if (iVar6 == 0) {
    pcVar5 = (char *)0x0;
  }
  else {
    pcVar5 = (char *)malloc((long)iVar6);
  }
  pVVar4->pArray = pcVar5;
  if (0 < iVar3) {
    lVar9 = 0;
    do {
      iVar3 = pVVar10->pArray[lVar9];
      if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return pVVar4;
      }
      pGVar1 = p->pObjs + iVar3;
      uVar7 = (ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff);
      if ((~*(uint *)(pGVar1 + -uVar7) & 0x1fffffff) == 0 || (int)*(uint *)(pGVar1 + -uVar7) < 0) {
        cVar8 = '\0';
      }
      else {
        iVar3 = Lms_ObjArea(pGVar1 + -uVar7);
        cVar8 = (char)iVar3;
      }
      uVar2 = pVVar4->nSize;
      if (uVar2 == pVVar4->nCap) {
        if ((int)uVar2 < 0x10) {
          if (pVVar4->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(0x10);
          }
          else {
            pcVar5 = (char *)realloc(pVVar4->pArray,0x10);
          }
          pVVar4->pArray = pcVar5;
          pVVar4->nCap = 0x10;
        }
        else {
          __size = (ulong)uVar2 * 2;
          if (pVVar4->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(__size);
          }
          else {
            pcVar5 = (char *)realloc(pVVar4->pArray,__size);
          }
          pVVar4->pArray = pcVar5;
          pVVar4->nCap = (int)__size;
        }
      }
      else {
        pcVar5 = pVVar4->pArray;
      }
      pVVar4->nSize = uVar2 + 1;
      pcVar5[(int)uVar2] = cVar8;
      lVar9 = lVar9 + 1;
      pVVar10 = p->vCos;
    } while (lVar9 < pVVar10->nSize);
  }
  return pVVar4;
}

Assistant:

Vec_Str_t * Lms_GiaAreas( Gia_Man_t * p )
{
    Vec_Str_t * vAreas;
    Gia_Obj_t * pObj;
    int i;
    vAreas = Vec_StrAlloc( Gia_ManCoNum(p) );
    Gia_ManForEachCo( p, pObj, i )
        Vec_StrPush( vAreas, (char)(Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) ? Lms_ObjArea(Gia_ObjFanin0(pObj)) : 0) );
    return vAreas;
}